

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HD44780Analyzer.cpp
# Opt level: O3

void __thiscall HD44780Analyzer::WorkerThread(HD44780Analyzer *this)

{
  HD44780AnalyzerSettings *pHVar1;
  char cVar2;
  U32 UVar3;
  int iVar4;
  AnalyzerChannelData *pAVar5;
  AnalyzerChannelData **ppAVar6;
  long lVar7;
  Channel local_40 [16];
  
  UVar3 = Analyzer::GetSampleRate();
  this->mSampleRateHz = UVar3;
  pAVar5 = (AnalyzerChannelData *)Analyzer::GetAnalyzerChannelData((Channel *)this);
  this->mE = pAVar5;
  pAVar5 = (AnalyzerChannelData *)Analyzer::GetAnalyzerChannelData((Channel *)this);
  this->mRS = pAVar5;
  pHVar1 = (this->mSettings)._M_ptr;
  Channel::Channel(local_40,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  cVar2 = Channel::operator!=(&pHVar1->mRWChannel,local_40);
  Channel::~Channel(local_40);
  if (cVar2 == '\0') {
    pAVar5 = (AnalyzerChannelData *)0x0;
  }
  else {
    pAVar5 = (AnalyzerChannelData *)Analyzer::GetAnalyzerChannelData((Channel *)this);
  }
  this->mRW = pAVar5;
  ppAVar6 = this->mDB;
  lVar7 = 0x40;
  do {
    pHVar1 = (this->mSettings)._M_ptr;
    Channel::Channel(local_40,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
    cVar2 = Channel::operator!=((Channel *)(&pHVar1->super_AnalyzerSettings + lVar7),local_40);
    Channel::~Channel(local_40);
    if (cVar2 == '\0') {
      pAVar5 = (AnalyzerChannelData *)0x0;
    }
    else {
      pAVar5 = (AnalyzerChannelData *)Analyzer::GetAnalyzerChannelData((Channel *)this);
    }
    *ppAVar6 = pAVar5;
    ppAVar6 = ppAVar6 + 1;
    lVar7 = lVar7 + 0x10;
  } while (lVar7 != 0xc0);
  iVar4 = AnalyzerChannelData::GetBitState();
  if (iVar4 == 1) {
    AnalyzerChannelData::AdvanceToNextEdge();
  }
  this->bitmode8 = (bool)(((this->mSettings)._M_ptr)->mStartIn4BitMode ^ 1);
  this->mLastEStart = 0;
  this->mWaitBusy = 0;
  do {
    GetTransfer(this);
    Analyzer::CheckIfThreadShouldExit();
  } while( true );
}

Assistant:

void HD44780Analyzer::WorkerThread()
{
    U32 dbline;

    // get sample rate
    mSampleRateHz = GetSampleRate();

    // setup channels
    mE = GetAnalyzerChannelData( mSettings->mEChannel );
    mRS = GetAnalyzerChannelData( mSettings->mRSChannel );
    if( mSettings->mRWChannel != UNDEFINED_CHANNEL )
        mRW = GetAnalyzerChannelData( mSettings->mRWChannel );
    else
        mRW = NULL;
    for( dbline = 0; dbline < 8; dbline++ )
        if( mSettings->mDBChannel[ dbline ] != UNDEFINED_CHANNEL )
            mDB[ dbline ] = GetAnalyzerChannelData( mSettings->mDBChannel[ dbline ] );
        else
            mDB[ dbline ] = NULL;

    // if we start high we need to move to low
    if( mE->GetBitState() == BIT_HIGH )
        mE->AdvanceToNextEdge();

    // we always start in 8-bit mode unless the force 4-bit mode option is selected
    // function set command can change modes
    bitmode8 = !mSettings->mStartIn4BitMode;

    // reset between E high pulse measurements
    mLastEStart = 0;

    // reset busy mode
    mWaitBusy = 0;

    // get frames
    for( ;; )
    {
        GetTransfer();
        CheckIfThreadShouldExit();
    }
}